

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void counterfeit_end(OBJ_DATA *obj,OBJ_AFFECT_DATA *af)

{
  char *pcVar1;
  
  if (obj->carried_by != (CHAR_DATA *)0x0) {
    act("You suddenly realize that $p is counterfeit, and really $T!",obj->carried_by,obj,
        obj->pIndexData->short_descr,3);
  }
  if ((obj->in_room != (ROOM_INDEX_DATA *)0x0) && (obj->in_room->people != (CHAR_DATA *)0x0)) {
    act("You suddenly realize that $p is counterfeit, and really $T!",obj->carried_by,obj,
        obj->pIndexData->short_descr,4);
  }
  free_pstring(obj->short_descr);
  pcVar1 = palloc_string(obj->pIndexData->short_descr);
  obj->short_descr = pcVar1;
  free_pstring(obj->name);
  pcVar1 = palloc_string(obj->pIndexData->name);
  obj->name = pcVar1;
  free_pstring(obj->description);
  pcVar1 = palloc_string(obj->pIndexData->description);
  obj->description = pcVar1;
  return;
}

Assistant:

void counterfeit_end(OBJ_DATA *obj, OBJ_AFFECT_DATA *af)
{

	if (obj->carried_by)
	{
		act("You suddenly realize that $p is counterfeit, and really $T!",
			obj->carried_by,
			obj,
			obj->pIndexData->short_descr,
			TO_CHAR);
	}

	if (obj->in_room && obj->in_room->people)
	{
		act("You suddenly realize that $p is counterfeit, and really $T!",
			obj->carried_by,
			obj,
			obj->pIndexData->short_descr,
			TO_ALL);
	}

	free_pstring(obj->short_descr);
	obj->short_descr = palloc_string(obj->pIndexData->short_descr);

	free_pstring(obj->name);
	obj->name = palloc_string(obj->pIndexData->name);

	free_pstring(obj->description);
	obj->description = palloc_string(obj->pIndexData->description);
}